

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomUrl::write(DomUrl *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QAnyStringView *pQVar2;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff48;
  DomString *this_00;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff50;
  QAnyStringView *this_01;
  undefined7 in_stack_ffffffffffffff68;
  byte bVar3;
  undefined1 local_60 [24];
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  pQVar2 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = pQVar2;
  bVar1 = QString::isEmpty((QString *)0x1c2909);
  bVar3 = 0;
  if (bVar1) {
    __n = 3;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"url",3);
    bVar3 = 1;
    QString::QString((QString *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    QString::toLower((QString *)in_stack_ffffffffffffff48);
  }
  QAnyStringView::QAnyStringView(this_01,(QString *)this);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)this_01);
  QString::~QString((QString *)0x1c29b3);
  if ((bVar3 & 1) != 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff50);
  }
  if ((this->m_children & 1) != 0) {
    this_00 = this->m_string;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(bVar3,in_stack_ffffffffffffff68),(size_t)this_01);
    DomString::write(this_00,(int)pQVar2,local_60,__n);
    QString::~QString((QString *)0x1c2a1f);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomUrl::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("url") : tagName.toLower());

    if (m_children & String)
        m_string->write(writer, u"string"_s);

    writer.writeEndElement();
}